

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O3

void __thiscall deqp::gls::ub::UniformBlock::UniformBlock(UniformBlock *this,char *blockName)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,blockName,&local_9);
  (this->m_instanceName)._M_dataplus._M_p = (pointer)&(this->m_instanceName).field_2;
  (this->m_instanceName)._M_string_length = 0;
  (this->m_instanceName).field_2._M_local_buf[0] = '\0';
  (this->m_uniforms).
  super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_uniforms).
  super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_uniforms).
  super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_arraySize = 0;
  this->m_flags = 0;
  return;
}

Assistant:

UniformBlock::UniformBlock (const char* blockName)
	: m_blockName	(blockName)
	, m_arraySize	(0)
	, m_flags		(0)
{
}